

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_unicode.c
# Opt level: O3

void PHYSFS_utf8ToUcs2(char *src,PHYSFS_uint16 *dst,PHYSFS_uint64 len)

{
  PHYSFS_uint16 PVar1;
  uint uVar2;
  ulong uVar3;
  char *local_28;
  
  uVar3 = len - 2;
  local_28 = src;
  while ((1 < uVar3 && (uVar2 = __PHYSFS_utf8codepoint(&local_28), uVar2 != 0))) {
    if (uVar2 == 0xffffffff) {
      uVar2 = 0x3f;
    }
    PVar1 = (PHYSFS_uint16)uVar2;
    if (0xffff < uVar2) {
      PVar1 = 0x3f;
    }
    *dst = PVar1;
    dst = dst + 1;
    uVar3 = uVar3 - 2;
  }
  *dst = 0;
  return;
}

Assistant:

void PHYSFS_utf8ToUcs2(const char *src, PHYSFS_uint16 *dst, PHYSFS_uint64 len)
{
    len -= sizeof (PHYSFS_uint16);   /* save room for null char. */
    while (len >= sizeof (PHYSFS_uint16))
    {
        PHYSFS_uint32 cp = __PHYSFS_utf8codepoint(&src);
        if (cp == 0)
            break;
        else if (cp == UNICODE_BOGUS_CHAR_VALUE)
            cp = UNICODE_BOGUS_CHAR_CODEPOINT;

        if (cp > 0xFFFF)  /* UTF-16 surrogates (bogus chars in UCS-2) */
            cp = UNICODE_BOGUS_CHAR_CODEPOINT;

        *(dst++) = cp;
        len -= sizeof (PHYSFS_uint16);
    } /* while */

    *dst = 0;
}